

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

char * __thiscall
spirv_cross::CompilerHLSL::to_storage_qualifiers_glsl(CompilerHLSL *this,SPIRVariable *var)

{
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  if (((var->storage == StorageClassUniformConstant) || (var->storage == StorageClassUniform)) ||
     (var->storage == PushConstant)) {
    this_local = (CompilerHLSL *)anon_var_dwarf_572f3b;
  }
  else {
    this_local = (CompilerHLSL *)0x65adc5;
  }
  return (char *)this_local;
}

Assistant:

const char *CompilerHLSL::to_storage_qualifiers_glsl(const SPIRVariable &var)
{
	// Input and output variables are handled specially in HLSL backend.
	// The variables are declared as global, private variables, and do not need any qualifiers.
	if (var.storage == StorageClassUniformConstant || var.storage == StorageClassUniform ||
	    var.storage == StorageClassPushConstant)
	{
		return "uniform ";
	}

	return "";
}